

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

expected<const_Command::Arg_*,_Commands::MatchFailure> *
make_expected_error(expected<const_Command::Arg_*,_Commands::MatchFailure> *__return_storage_ptr__,
                   shared_ptr<const_SyntaxTree> *hint,Arg *arginfo)

{
  unreachable_exception *this;
  MatchFailure local_180;
  unexpected_type<Commands::MatchFailure> local_168;
  MatchFailure local_150;
  unexpected_type<Commands::MatchFailure> local_138;
  MatchFailure local_120;
  unexpected_type<Commands::MatchFailure> local_108;
  MatchFailure local_f0;
  unexpected_type<Commands::MatchFailure> local_d8;
  MatchFailure local_c0;
  unexpected_type<Commands::MatchFailure> local_a8;
  MatchFailure local_90;
  unexpected_type<Commands::MatchFailure> local_78;
  MatchFailure local_50;
  unexpected_type<Commands::MatchFailure> local_38;
  Arg *local_20;
  Arg *arginfo_local;
  shared_ptr<const_SyntaxTree> *hint_local;
  
  local_20 = arginfo;
  arginfo_local = (Arg *)hint;
  hint_local = (shared_ptr<const_SyntaxTree> *)__return_storage_ptr__;
  switch(arginfo->type) {
  case Param:
    std::shared_ptr<const_SyntaxTree>::shared_ptr(&local_50.context,hint);
    local_50.reason = BadArgument;
    nonstd::make_unexpected<Commands::MatchFailure>(&local_38,&local_50);
    nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
              (__return_storage_ptr__,&local_38);
    nonstd::unexpected_type<Commands::MatchFailure>::~unexpected_type(&local_38);
    Commands::MatchFailure::~MatchFailure(&local_50);
    break;
  case Label:
    std::shared_ptr<const_SyntaxTree>::shared_ptr(&local_f0.context,hint);
    local_f0.reason = NoSuchLabel;
    nonstd::make_unexpected<Commands::MatchFailure>(&local_d8,&local_f0);
    nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
              (__return_storage_ptr__,&local_d8);
    nonstd::unexpected_type<Commands::MatchFailure>::~unexpected_type(&local_d8);
    Commands::MatchFailure::~MatchFailure(&local_f0);
    break;
  case Integer:
    std::shared_ptr<const_SyntaxTree>::shared_ptr(&local_90.context,hint);
    local_90.reason = ExpectedInt;
    nonstd::make_unexpected<Commands::MatchFailure>(&local_78,&local_90);
    nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
              (__return_storage_ptr__,&local_78);
    nonstd::unexpected_type<Commands::MatchFailure>::~unexpected_type(&local_78);
    Commands::MatchFailure::~MatchFailure(&local_90);
    break;
  case Float:
    std::shared_ptr<const_SyntaxTree>::shared_ptr(&local_c0.context,hint);
    local_c0.reason = ExpectedFloat;
    nonstd::make_unexpected<Commands::MatchFailure>(&local_a8,&local_c0);
    nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
              (__return_storage_ptr__,&local_a8);
    nonstd::unexpected_type<Commands::MatchFailure>::~unexpected_type(&local_a8);
    Commands::MatchFailure::~MatchFailure(&local_c0);
    break;
  case TextLabel:
  case TextLabel16:
    std::shared_ptr<const_SyntaxTree>::shared_ptr(&local_150.context,hint);
    local_150.reason = ExpectedTextLabel;
    nonstd::make_unexpected<Commands::MatchFailure>(&local_138,&local_150);
    nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
              (__return_storage_ptr__,&local_138);
    nonstd::unexpected_type<Commands::MatchFailure>::~unexpected_type(&local_138);
    Commands::MatchFailure::~MatchFailure(&local_150);
    break;
  case TextLabel32:
  case String:
    std::shared_ptr<const_SyntaxTree>::shared_ptr(&local_180.context,hint);
    local_180.reason = ExpectedStringLiteral;
    nonstd::make_unexpected<Commands::MatchFailure>(&local_168,&local_180);
    nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
              (__return_storage_ptr__,&local_168);
    nonstd::unexpected_type<Commands::MatchFailure>::~unexpected_type(&local_168);
    Commands::MatchFailure::~MatchFailure(&local_180);
    break;
  case Constant:
    std::shared_ptr<const_SyntaxTree>::shared_ptr(&local_120.context,hint);
    local_120.reason = NoSuchConstant;
    nonstd::make_unexpected<Commands::MatchFailure>(&local_108,&local_120);
    nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
              (__return_storage_ptr__,&local_108);
    nonstd::unexpected_type<Commands::MatchFailure>::~unexpected_type(&local_108);
    Commands::MatchFailure::~MatchFailure(&local_120);
    break;
  default:
    this = (unreachable_exception *)__cxa_allocate_exception(0x10);
    unreachable_exception::unreachable_exception
              (this,
               "Unreachable code reached at /workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/commands.cpp(239)."
              );
    __cxa_throw(this,&unreachable_exception::typeinfo,unreachable_exception::~unreachable_exception)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

static auto make_expected_error(const shared_ptr<const SyntaxTree>& hint, 
                                const Command::Arg& arginfo) -> expected<const Command::Arg*, MatchFailure>
{
    switch(arginfo.type)
    {
        case ArgType::Param:
            return make_unexpected(MatchFailure{ hint, MatchFailure::BadArgument });
        case ArgType::Integer:
            return make_unexpected(MatchFailure{ hint, MatchFailure::ExpectedInt });
        case ArgType::Float:
            return make_unexpected(MatchFailure{ hint, MatchFailure::ExpectedFloat });
        case ArgType::Label:
            return make_unexpected(MatchFailure{ hint, MatchFailure::NoSuchLabel });
        case ArgType::Constant:
            return make_unexpected(MatchFailure{ hint, MatchFailure::NoSuchConstant });
        case ArgType::TextLabel:
        case ArgType::TextLabel16:
            return make_unexpected(MatchFailure{ hint, MatchFailure::ExpectedTextLabel });
        case ArgType::TextLabel32:
        case ArgType::String:
            return make_unexpected(MatchFailure{ hint, MatchFailure::ExpectedStringLiteral });
        default:
            Unreachable();
    }
}